

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_indirect_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_12e98c::CpuIndirectIndexedTest_sbc_indirect_indexed_Test::
~CpuIndirectIndexedTest_sbc_indirect_indexed_Test
          (CpuIndirectIndexedTest_sbc_indirect_indexed_Test *this)

{
  CpuIndirectIndexedTest_sbc_indirect_indexed_Test *this_local;
  
  ~CpuIndirectIndexedTest_sbc_indirect_indexed_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuIndirectIndexedTest, sbc_indirect_indexed) {
    registers.a = 0xD0;
    registers.p = C_FLAG;
    expected.a = 0xE0;
    expected.p = N_FLAG;
    memory_content = 0xF0;
    run_read_instruction_without_pagecrossing(SBC_INDINX);
}